

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids)

{
  string *aDomainName;
  undefined8 uVar1;
  long lVar2;
  char *pcVar3;
  pointer pbVar4;
  bool bVar5;
  Status SVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  pointer pbVar10;
  Interpreter *pIVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar12;
  pointer pbVar13;
  format_string_checker<char> *pfVar14;
  bool bVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  StringArray unresolved;
  string errorMessage;
  Error error;
  writer write;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [8];
  char *pcStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [2];
  undefined1 local_178 [8];
  char *pcStack_170;
  ulong local_168;
  char local_160 [8];
  format_string_checker<char> *local_158;
  parse_func local_150 [1];
  type local_148;
  uint *local_140;
  long local_138;
  uint local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  Value *local_120;
  Interpreter *local_118;
  pointer local_110;
  string local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  string local_d8;
  type local_b8;
  uint *local_b0;
  long local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined1 local_90 [32];
  undefined4 local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  local_148 = none_type;
  local_140 = &local_130;
  local_138 = 0;
  local_130 = local_130 & 0xffffff00;
  if ((this->mContext).mNwkAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mContext).mNwkAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar15 = IsFeatureSupported((Interpreter *)__return_storage_ptr__,
                                  mMultiNetworkSyntax_abi_cxx11_,aExpr);
      if (bVar15) {
        if ((this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          aDomainName = (this->mContext).mDomAliases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->mContext).mDomAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)aDomainName) < 0x21)
          {
            SVar6 = persistent_storage::Registry::GetNetworkXpansInDomain
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,aDomainName,aNids);
            if (SVar6 != kSuccess) {
              if (SVar6 == kNotFound) {
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                          ();
                pbVar13 = (this->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1c8._0_8_ = (pbVar13->_M_dataplus)._M_p;
                local_1c8._8_8_ = pbVar13->_M_string_length;
                fmt_02.size_ = 0xd;
                fmt_02.data_ = (char *)0x15;
                args_06.field_1.values_ = in_R9.values_;
                args_06.desc_ = (unsigned_long_long)local_1c8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_1a8,(v10 *)"domain \'{}\' not found",fmt_02,args_06);
                local_178._0_4_ = 0x12;
                pcStack_170 = local_160;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pcStack_170,local_1a8,pcStack_1a0 + (long)local_1a8);
              }
              else {
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_FMT_COMPILE_STRING,_0>
                          ();
                pbVar13 = (this->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1a8 = (undefined1  [8])(pbVar13->_M_dataplus)._M_p;
                pcStack_1a0 = (char *)pbVar13->_M_string_length;
                local_198[0]._0_8_ = ZEXT18(SVar6);
                fmt_03.size_ = 0x1d;
                fmt_03.data_ = (char *)0x2c;
                args_09.field_1.values_ = in_R9.values_;
                args_09.desc_ = (unsigned_long_long)local_1a8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_1c8,
                           (v10 *)"domain \'{}\' failed to resolve with status={}",fmt_03,args_09);
                local_178._0_4_ = 0x12;
                pcStack_170 = local_160;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pcStack_170,local_1c8._0_8_,
                           (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
              }
              local_148 = local_178._0_4_;
              std::__cxx11::string::operator=((string *)&local_140,(string *)&pcStack_170);
              if (pcStack_170 != local_160) {
                operator_delete(pcStack_170);
              }
              if (SVar6 == kNotFound) {
LAB_001cdd58:
                if (local_1a8 != (undefined1  [8])local_198) {
                  operator_delete((void *)local_1a8);
                }
              }
              else {
                if ((format_string_checker<char> *)local_1c8._0_8_ !=
                    (format_string_checker<char> *)(local_1c8 + 0x10)) {
                  operator_delete((void *)local_1c8._0_8_);
                }
                if (SVar6 == kNotFound) goto LAB_001cdd58;
              }
              if (SVar6 != kSuccess) goto LAB_001cd976;
            }
LAB_001cdd74:
            if ((aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish !=
                (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start) goto LAB_001cd976;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_10.field_1.args_ = in_R9.args_;
            args_10.desc_ = (unsigned_long_long)&local_58.field_2;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_108,(v10 *)"specified alias(es) resolved to an empty list of networks"
                       ,(string_view)ZEXT816(0x39),args_10);
            local_178._0_4_ = 2;
            pcStack_170 = local_160;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pcStack_170,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            local_148 = local_178._0_4_;
            std::__cxx11::string::operator=((string *)&local_140,(string *)&pcStack_170);
            if (pcStack_170 != local_160) {
              operator_delete(pcStack_170);
            }
            paVar8 = &local_108.field_2;
            goto LAB_001cd968;
          }
          local_178 = (undefined1  [8])((ulong)(uint)local_178._4_4_ << 0x20);
          pcVar12 = "multiple domain specification not allowed";
          pcStack_170 = "multiple domain specification not allowed";
          local_168 = 0x29;
          local_160 = (char  [8])0x0;
          local_150[0] = (parse_func)0x0;
          local_158 = (format_string_checker<char> *)local_178;
          local_108._M_dataplus._M_p = (pointer)local_178;
          do {
            if (pcVar12 == "") break;
            pcVar9 = pcVar12;
            if (*pcVar12 == '{') {
LAB_001cdb6d:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&local_108,pcVar12,pcVar9);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar9,"",(format_string_checker<char> *)local_178);
              bVar15 = true;
            }
            else {
              pcVar9 = pcVar12 + 1;
              bVar15 = pcVar9 != "";
              if (bVar15) {
                if (*pcVar9 != '{') {
                  pcVar3 = pcVar12 + 2;
                  do {
                    pcVar9 = pcVar3;
                    bVar15 = pcVar9 != "";
                    if (pcVar9 == "") goto LAB_001cdb69;
                    pcVar3 = pcVar9 + 1;
                  } while (*pcVar9 != '{');
                }
                bVar15 = true;
              }
LAB_001cdb69:
              if (bVar15) goto LAB_001cdb6d;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&local_108,pcVar12,"");
              bVar15 = false;
            }
          } while (bVar15);
          args_07.field_1.values_ = in_R9.values_;
          args_07.desc_ = (unsigned_long_long)local_178;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_1c8,(v10 *)"multiple domain specification not allowed",
                     (string_view)ZEXT816(0x29),args_07);
          local_1a8._0_4_ = 2;
          pcStack_1a0 = local_198[0]._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_1a0,local_1c8._0_8_,
                     (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
        }
        else {
          local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffff00000000);
          pcVar12 = "--nwk and --dom are mutually exclusive";
          pcStack_170 = "--nwk and --dom are mutually exclusive";
          local_168 = 0x26;
          local_160 = (char  [8])0x0;
          local_150[0] = (parse_func)0x0;
          local_158 = (format_string_checker<char> *)local_178;
          local_108._M_dataplus._M_p = (pointer)local_178;
          do {
            if (pcVar12 == "") break;
            pcVar9 = pcVar12;
            if (*pcVar12 == '{') {
LAB_001cd131:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&local_108,pcVar12,pcVar9);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar9,"",(format_string_checker<char> *)local_178);
              bVar15 = true;
            }
            else {
              pcVar9 = pcVar12 + 1;
              bVar15 = pcVar9 != "";
              if (bVar15) {
                if (*pcVar9 != '{') {
                  pcVar3 = pcVar12 + 2;
                  do {
                    pcVar9 = pcVar3;
                    bVar15 = pcVar9 != "";
                    if (pcVar9 == "") goto LAB_001cd12d;
                    pcVar3 = pcVar9 + 1;
                  } while (*pcVar9 != '{');
                }
                bVar15 = true;
              }
LAB_001cd12d:
              if (bVar15) goto LAB_001cd131;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&local_108,pcVar12,"");
              bVar15 = false;
            }
          } while (bVar15);
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_178;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_1c8,(v10 *)"--nwk and --dom are mutually exclusive",
                     (string_view)ZEXT816(0x26),args_00);
          local_1a8._0_4_ = 2;
          pcStack_1a0 = local_198[0]._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_1a0,local_1c8._0_8_,
                     (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
        }
      }
      else {
        local_178._0_4_ = cstring_type;
        pcVar12 = "\'{}\' is not supported by the command";
        pcStack_170 = "\'{}\' is not supported by the command";
        local_168 = 0x24;
        local_160 = (char  [8])0x100000000;
        local_150[0] = ::fmt::v10::detail::
                       parse_format_specs<char[6],fmt::v10::detail::compile_parse_context<char>>;
        local_158 = (format_string_checker<char> *)local_178;
        local_108._M_dataplus._M_p = (pointer)local_178;
        do {
          if (pcVar12 == "") break;
          pcVar9 = pcVar12;
          if (*pcVar12 == '{') {
LAB_001cd8a6:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>
            ::writer::operator()((writer *)&local_108,pcVar12,pcVar9);
            pcVar12 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[6]>&>
                                (pcVar9,"",(format_string_checker<char> *)local_178);
            bVar15 = true;
          }
          else {
            pcVar9 = pcVar12 + 1;
            bVar15 = pcVar9 != "";
            if (bVar15) {
              if (*pcVar9 != '{') {
                pcVar3 = pcVar12 + 2;
                do {
                  pcVar9 = pcVar3;
                  bVar15 = pcVar9 != "";
                  if (pcVar9 == "") goto LAB_001cd8a2;
                  pcVar3 = pcVar9 + 1;
                } while (*pcVar9 != '{');
              }
              bVar15 = true;
            }
LAB_001cd8a2:
            if (bVar15) goto LAB_001cd8a6;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>
            ::writer::operator()((writer *)&local_108,pcVar12,"");
            bVar15 = false;
          }
        } while (bVar15);
        local_178 = (undefined1  [8])0x26a4aa;
        fmt_01.size_ = 0xc;
        fmt_01.data_ = (char *)0x24;
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)local_178;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_1c8,(v10 *)"\'{}\' is not supported by the command",fmt_01,
                   args_05);
        local_1a8._0_4_ = 2;
        pcStack_1a0 = local_198[0]._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_1a0,local_1c8._0_8_,
                   (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
      }
      goto LAB_001cd939;
    }
    local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffff00000000);
    pcVar12 = "Either network or domain list must have entries for multi-network command";
    pcStack_170 = "Either network or domain list must have entries for multi-network command";
    local_168 = 0x49;
    local_160 = (char  [8])0x0;
    local_150[0] = (parse_func)0x0;
    local_1c8._0_8_ = (format_string_checker<char> *)local_178;
    local_158 = (format_string_checker<char> *)local_178;
    do {
      if (pcVar12 == "") break;
      pcVar9 = pcVar12;
      if (*pcVar12 == '{') {
LAB_001cd76f:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_1c8,pcVar12,pcVar9);
        pcVar12 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar9,"",(format_string_checker<char> *)local_178);
        bVar15 = true;
      }
      else {
        pcVar9 = pcVar12 + 1;
        bVar15 = pcVar9 != "";
        if (bVar15) {
          if (*pcVar9 != '{') {
            pcVar3 = pcVar12 + 2;
            do {
              pcVar9 = pcVar3;
              bVar15 = pcVar9 != "";
              if (pcVar9 == "") goto LAB_001cd76b;
              pcVar3 = pcVar9 + 1;
            } while (*pcVar9 != '{');
          }
          bVar15 = true;
        }
LAB_001cd76b:
        if (bVar15) goto LAB_001cd76f;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_1c8,pcVar12,"");
        bVar15 = false;
      }
    } while (bVar15);
    args_04.field_1.args_ = in_R9.args_;
    args_04.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_1a8,
               (v10 *)"Either network or domain list must have entries for multi-network command",
               (string_view)ZEXT816(0x49),args_04);
    local_70 = 2;
    local_68[0] = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_1a8,pcStack_1a0 + (long)local_1a8);
    if (local_68[0] != &local_58) {
      operator_delete(local_68[0]);
    }
    paVar8 = local_198;
LAB_001cd968:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar8->_M_allocated_capacity)[-2] != paVar8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]);
    }
  }
  else {
    bVar5 = IsFeatureSupported((Interpreter *)__return_storage_ptr__,mMultiNetworkSyntax_abi_cxx11_,
                               aExpr);
    bVar15 = false;
    if ((((this->mContext).mImportFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->mContext).mImportFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) &&
        (pbVar13 = (this->mContext).mNwkAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, bVar15 = false,
        (long)(this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 == 0x20)) &&
       (iVar7 = std::__cxx11::string::compare((char *)pbVar13), iVar7 != 0)) {
      iVar7 = std::__cxx11::string::compare
                        ((char *)(this->mContext).mNwkAliases.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      bVar15 = iVar7 != 0;
    }
    if (!bVar15 && !bVar5) {
      local_178._0_4_ = cstring_type;
      pcVar12 = "\'{}\' is not supported by the command";
      pcStack_170 = "\'{}\' is not supported by the command";
      local_168 = 0x24;
      local_160 = (char  [8])0x100000000;
      local_150[0] = ::fmt::v10::detail::
                     parse_format_specs<char[6],fmt::v10::detail::compile_parse_context<char>>;
      local_158 = (format_string_checker<char> *)local_178;
      local_108._M_dataplus._M_p = (pointer)local_178;
      do {
        if (pcVar12 == "") break;
        pcVar9 = pcVar12;
        if (*pcVar12 == '{') {
LAB_001cd248:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
          writer::operator()((writer *)&local_108,pcVar12,pcVar9);
          pcVar12 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[6]>&>
                              (pcVar9,"",(format_string_checker<char> *)local_178);
          bVar15 = true;
        }
        else {
          pcVar9 = pcVar12 + 1;
          bVar15 = pcVar9 != "";
          if (bVar15) {
            if (*pcVar9 != '{') {
              pcVar3 = pcVar12 + 2;
              do {
                pcVar9 = pcVar3;
                bVar15 = pcVar9 != "";
                if (pcVar9 == "") goto LAB_001cd244;
                pcVar3 = pcVar9 + 1;
              } while (*pcVar9 != '{');
            }
            bVar15 = true;
          }
LAB_001cd244:
          if (bVar15) goto LAB_001cd248;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
          writer::operator()((writer *)&local_108,pcVar12,"");
          bVar15 = false;
        }
      } while (bVar15);
      local_178 = (undefined1  [8])0x26a4a4;
      fmt.size_ = 0xc;
      fmt.data_ = (char *)0x24;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_178;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_1c8,(v10 *)"\'{}\' is not supported by the command",fmt,args_01);
      local_1a8._0_4_ = 2;
      pcStack_1a0 = local_198[0]._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_1a0,local_1c8._0_8_,
                 (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
LAB_001cd939:
      local_148 = local_1a8._0_4_;
      std::__cxx11::string::operator=((string *)&local_140,(string *)&pcStack_1a0);
      if (pcStack_1a0 != local_198[0]._M_local_buf + 8) {
        operator_delete(pcStack_1a0);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1c8 + 0x10);
      goto LAB_001cd968;
    }
    local_120 = __return_storage_ptr__;
    if ((this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_178 = (undefined1  [8])((ulong)(uint)local_178._4_4_ << 0x20);
      pcVar12 = "--nwk and --dom are mutually exclusive";
      pcStack_170 = "--nwk and --dom are mutually exclusive";
      local_168 = 0x26;
      local_160 = (char  [8])0x0;
      local_150[0] = (parse_func)0x0;
      local_158 = (format_string_checker<char> *)local_178;
      local_108._M_dataplus._M_p = (pointer)local_178;
      do {
        if (pcVar12 == "") break;
        pcVar9 = pcVar12;
        if (*pcVar12 == '{') {
LAB_001ccfee:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_108,pcVar12,pcVar9);
          pcVar12 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar9,"",(format_string_checker<char> *)local_178);
          bVar15 = true;
        }
        else {
          pcVar9 = pcVar12 + 1;
          bVar15 = pcVar9 != "";
          if (bVar15) {
            if (*pcVar9 != '{') {
              pcVar3 = pcVar12 + 2;
              do {
                pcVar9 = pcVar3;
                bVar15 = pcVar9 != "";
                if (pcVar9 == "") goto LAB_001ccfea;
                pcVar3 = pcVar9 + 1;
              } while (*pcVar9 != '{');
            }
            bVar15 = true;
          }
LAB_001ccfea:
          if (bVar15) goto LAB_001ccfee;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_108,pcVar12,"");
          bVar15 = false;
        }
      } while (bVar15);
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_178;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_1c8,(v10 *)"--nwk and --dom are mutually exclusive",
                 (string_view)ZEXT816(0x26),args);
      __return_storage_ptr__ = local_120;
      local_1a8._0_4_ = 2;
      pcStack_1a0 = local_198[0]._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_1a0,local_1c8._0_8_,
                 (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
      goto LAB_001cd939;
    }
    pbVar13 = (this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pIVar11 = this;
    pbVar4 = pbVar10;
    local_e0 = aNids;
    if (pbVar13 != pbVar10) {
      do {
        local_110 = pbVar4;
        local_118 = pIVar11;
        iVar7 = std::__cxx11::string::compare((char *)pbVar13);
        if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar13), iVar7 == 0))
           && ((long)(this->mContext).mNwkAliases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mContext).mNwkAliases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
          local_178._0_4_ = string_type;
          pcVar12 = "\'{}\' must not combine with any other network alias";
          pcStack_170 = "\'{}\' must not combine with any other network alias";
          local_168 = 0x32;
          local_160 = (char  [8])0x100000000;
          local_158 = (format_string_checker<char> *)local_178;
          local_150[0] = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_108._M_dataplus._M_p = (pointer)local_158;
          do {
            if (pcVar12 == "") break;
            pcVar9 = pcVar12;
            if (*pcVar12 == '{') {
LAB_001cd3d9:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&local_108,pcVar12,pcVar9);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                  (pcVar9,"",(format_string_checker<char> *)local_178);
              bVar15 = true;
            }
            else {
              pcVar9 = pcVar12 + 1;
              bVar15 = pcVar9 != "";
              if (bVar15) {
                if (*pcVar9 != '{') {
                  pcVar3 = pcVar12 + 2;
                  do {
                    pcVar9 = pcVar3;
                    bVar15 = pcVar9 != "";
                    if (pcVar9 == "") goto LAB_001cd3d5;
                    pcVar3 = pcVar9 + 1;
                  } while (*pcVar9 != '{');
                }
                bVar15 = true;
              }
LAB_001cd3d5:
              if (bVar15) goto LAB_001cd3d9;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&local_108,pcVar12,"");
              bVar15 = false;
            }
          } while (bVar15);
          local_178 = (undefined1  [8])(pbVar13->_M_dataplus)._M_p;
          pcStack_170 = (char *)pbVar13->_M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x32;
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)local_178;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_1c8,
                     (v10 *)"\'{}\' must not combine with any other network alias",fmt_00,args_02);
          local_1a8._0_4_ = 2;
          pcStack_1a0 = local_198[0]._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_1a0,local_1c8._0_8_,
                     (pointer)(local_1c8._0_8_ + (long)(type *)local_1c8._8_8_));
          pbVar10 = local_110;
          local_148 = local_1a8._0_4_;
          std::__cxx11::string::operator=((string *)&local_140,(string *)&pcStack_1a0);
          if (pcStack_1a0 != local_198[0]._M_local_buf + 8) {
            operator_delete(pcStack_1a0);
          }
          if ((format_string_checker<char> *)local_1c8._0_8_ !=
              (format_string_checker<char> *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
          iVar7 = 4;
          bVar15 = false;
          this = local_118;
        }
        else {
          iVar7 = 0;
          bVar15 = true;
        }
        if (!bVar15) goto LAB_001cd4e6;
        pbVar13 = pbVar13 + 1;
        pIVar11 = local_118;
        pbVar4 = local_110;
      } while (pbVar13 != pbVar10);
    }
    iVar7 = 7;
LAB_001cd4e6:
    __return_storage_ptr__ = local_120;
    if (iVar7 != 4) {
      if (iVar7 != 7) goto LAB_001cda2d;
      local_1c8._0_8_ = (format_string_checker<char> *)0x0;
      local_1c8._8_8_ = (format_string_checker<char> *)0x0;
      local_1c8._16_8_ = 0;
      SVar6 = persistent_storage::Registry::GetNetworkXpansByAliases
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(StringArray *)this,local_e0,(StringArray *)local_1c8);
      uVar1 = local_1c8._8_8_;
      if (local_1c8._0_8_ != local_1c8._8_8_) {
        local_110 = (pointer)(ulong)SVar6;
        local_118 = (Interpreter *)((ulong)SVar6 << 2);
        pfVar14 = (format_string_checker<char> *)local_1c8._0_8_;
        do {
          local_178 = (undefined1  [8])&local_168;
          pcStack_170 = (char *)0x0;
          local_168 = local_168 & 0xffffffffffffff00;
          pcVar12 = "failed to resolve";
          if (SVar6 < kError) {
            pcVar12 = &DAT_00268fcc +
                      *(int *)((long)&local_118[0x315b].mThreadAdministratorPasscode.field_2 + 0xc);
          }
          std::__cxx11::string::_M_replace((ulong)local_178,0,(char *)0x0,(ulong)pcVar12);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)pfVar14,
                     (pfVar14->context_).super_basic_format_parse_context<char>.format_str_.data_ +
                     *(long *)pfVar14);
          pIVar11 = (Interpreter *)local_90;
          local_90._0_8_ = (pointer)(local_90 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,local_178,pcStack_170 + (long)local_178);
          PrintNetworkMessage(pIVar11,&local_d8,(string *)local_90,kYellow);
          if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_178 != (undefined1  [8])&local_168) {
            operator_delete((void *)local_178);
          }
          pfVar14 = (format_string_checker<char> *)&(pfVar14->context_).types_;
        } while (pfVar14 != (format_string_checker<char> *)uVar1);
      }
      aNids = local_e0;
      __return_storage_ptr__ = local_120;
      if ((local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        __return_storage_ptr__ = local_120;
        args_08.field_1.values_ = in_R9.values_;
        args_08.desc_ = (unsigned_long_long)&local_108;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_1a8,
                   (v10 *)"specified alias(es) resolved to an empty list of networks",
                   (string_view)ZEXT816(0x39),args_08);
        local_178._0_4_ = 0x12;
        pcStack_170 = local_160;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_170,local_1a8,pcStack_1a0 + (long)local_1a8);
      }
      else {
        if (SVar6 == kSuccess) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c8);
          goto LAB_001cdd74;
        }
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_03.field_1.values_ = in_R9.values_;
        args_03.desc_ = (unsigned_long_long)&local_108;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_1a8,(v10 *)"failed to resolve",(string_view)ZEXT816(0x11),args_03
                  );
        local_178._0_4_ = 0x12;
        pcStack_170 = local_160;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_170,local_1a8,pcStack_1a0 + (long)local_1a8);
      }
      local_148 = local_178._0_4_;
      std::__cxx11::string::operator=((string *)&local_140,(string *)&pcStack_170);
      if (pcStack_170 != local_160) {
        operator_delete(pcStack_170);
      }
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8);
    }
  }
LAB_001cd976:
  lVar2 = local_138;
  local_b8 = local_148;
  if (local_140 == &local_130) {
    uStack_98 = uStack_128;
    uStack_94 = uStack_124;
    local_b0 = &local_a0;
  }
  else {
    local_b0 = local_140;
  }
  _local_a0 = CONCAT44(uStack_12c,local_130);
  local_a8 = local_138;
  local_138 = 0;
  local_130 = local_130 & 0xffffff00;
  (__return_storage_ptr__->mError).mCode = local_148;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  local_140 = &local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->mError).mMessage,local_b0,lVar2 + (long)local_b0);
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
LAB_001cda2d:
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ValidateMultiNetworkSyntax(const Expression &aExpr, std::vector<uint64_t> &aNids)
{
    Error error;
    bool  supported;

    if (mContext.mNwkAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        // MN-syntax is also supported for import from multi-entry JSON
        supported |= mContext.mImportFiles.size() > 0 && mContext.mNwkAliases.size() == 1 &&
                     mContext.mNwkAliases[0] != ALIAS_ALL && mContext.mNwkAliases[0] != ALIAS_OTHERS;
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_NETWORK));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mDomAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // validate group alias usage; if used, it must be alone
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                VerifyOrExit(mContext.mNwkAliases.size() == 1, error = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
            }
        }
        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, aNids, unresolved);
        for (const auto &alias : unresolved)
        {
            std::string errorMessage;
            switch (status)
            {
            case RegistryStatus::kAmbiguity:
                errorMessage = "alias ambiguous";
                break;
            case RegistryStatus::kSuccess:  // partially successful resolution
            case RegistryStatus::kNotFound: // failed to find any
                errorMessage = "alias not found";
                break;
            default:
                errorMessage = RUNTIME_RESOLVING_FAILED;
            }
            PrintNetworkMessage(alias, errorMessage, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(aNids.size() > 0, error = ERROR_REGISTRY_ERROR(RUNTIME_EMPTY_NIDS));
        VerifyOrExit(status == RegistryStatus::kSuccess, error = ERROR_REGISTRY_ERROR(RUNTIME_RESOLVING_FAILED));
    }
    else if (mContext.mDomAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_DOMAIN));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mNwkAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // domain must be single
        VerifyOrExit(mContext.mDomAliases.size() < 2, error = ERROR_INVALID_ARGS(SYNTAX_MULTI_DOMAIN));
        RegistryStatus status = mRegistry->GetNetworkXpansInDomain(mContext.mDomAliases.front(), aNids);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     error = status == RegistryStatus::kNotFound
                                 ? ERROR_REGISTRY_ERROR("domain '{}' not found", mContext.mDomAliases[0])
                                 : ERROR_REGISTRY_ERROR("domain '{}' failed to resolve with status={}",
                                                        mContext.mDomAliases.front(), static_cast<int>(status)));
    }
    else
    {
        // as we came here to evaluate multi-network command, either
        // network or domain list must have entries
        VerifyOrExit(false,
                     ERROR_INVALID_ARGS(
                         "Either network or domain list must have entries for multi-network command")); // must not hit
                                                                                                        // this, ever
    }

    VerifyOrExit(aNids.size() > 0, error = ERROR_INVALID_ARGS(RUNTIME_EMPTY_NIDS));
exit:
    return error;
}